

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::Parser::LocationRecorder::AddPath
          (LocationRecorder *this,int path_component)

{
  RepeatedField<int> *this_00;
  uint uVar1;
  Location *pLVar2;
  int *piVar3;
  int tmp;
  
  pLVar2 = this->location_;
  this_00 = &pLVar2->path_;
  uVar1 = (pLVar2->path_).current_size_;
  if (uVar1 == (pLVar2->path_).total_size_) {
    RepeatedField<int>::Reserve(this_00,uVar1 + 1);
    piVar3 = RepeatedField<int>::elements(this_00);
    piVar3[uVar1] = path_component;
  }
  else {
    piVar3 = RepeatedField<int>::elements(this_00);
    piVar3[uVar1] = path_component;
  }
  this_00->current_size_ = uVar1 + 1;
  return;
}

Assistant:

void Parser::LocationRecorder::AddPath(int path_component) {
  location_->add_path(path_component);
}